

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void callFinaliser(sqlite3 *db,int offset)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  _func_int_sqlite3_vtab_ptr *x;
  sqlite3_vtab *p;
  VTable *pVTab;
  int i;
  code *in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  int local_10;
  
  if (*(long *)(in_RDI + 0x1c8) != 0) {
    for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x1a4); local_10 = local_10 + 1) {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1c8) + (long)local_10 * 8);
      in_stack_ffffffffffffffe0 = *(sqlite3 **)(lVar1 + 0x10);
      if ((in_stack_ffffffffffffffe0 != (sqlite3 *)0x0) &&
         (in_stack_ffffffffffffffd8 =
               *(code **)((long)&in_stack_ffffffffffffffe0->pVfs->iVersion + (long)in_ESI),
         in_stack_ffffffffffffffd8 != (code *)0x0)) {
        (*in_stack_ffffffffffffffd8)(in_stack_ffffffffffffffe0);
      }
      *(undefined4 *)(lVar1 + 0x20) = 0;
      sqlite3VtabUnlock((VTable *)in_stack_ffffffffffffffe0);
    }
    sqlite3DbFree(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    *(undefined4 *)(in_RDI + 0x1a4) = 0;
    *(undefined8 *)(in_RDI + 0x1c8) = 0;
  }
  return;
}

Assistant:

static void callFinaliser(sqlite3 *db, int offset){
  int i;
  if( db->aVTrans ){
    for(i=0; i<db->nVTrans; i++){
      VTable *pVTab = db->aVTrans[i];
      sqlite3_vtab *p = pVTab->pVtab;
      if( p ){
        int (*x)(sqlite3_vtab *);
        x = *(int (**)(sqlite3_vtab *))((char *)p->pModule + offset);
        if( x ) x(p);
      }
      pVTab->iSavepoint = 0;
      sqlite3VtabUnlock(pVTab);
    }
    sqlite3DbFree(db, db->aVTrans);
    db->nVTrans = 0;
    db->aVTrans = 0;
  }
}